

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O3

bool __thiscall cmFileCopier::ReportMissing(cmFileCopier *this,string *fromFile)

{
  char *__s;
  cmCommand *this_00;
  size_t sVar1;
  ostream *poVar2;
  ostringstream e;
  undefined1 auStack_1b8 [8];
  string local_1b0;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  __s = this->Name;
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_1b8 + (long)*(_func_int **)(local_190._0_8_ + -0x18)) + 0x28);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," cannot find \"",0xe);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(fromFile->_M_dataplus)._M_p,fromFile->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\".",2);
  this_00 = &this->FileCommand->super_cmCommand;
  std::__cxx11::stringbuf::str();
  cmCommand::SetError(this_00,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return false;
}

Assistant:

bool cmFileCopier::ReportMissing(const std::string& fromFile)
{
  // The input file does not exist and installation is not optional.
  std::ostringstream e;
  e << this->Name << " cannot find \"" << fromFile << "\".";
  this->FileCommand->SetError(e.str());
  return false;
}